

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O1

void __thiscall gmlc::networking::AsioContextManager::haltContextLoop(AsioContextManager *this)

{
  atomic<int> *paVar1;
  size_t *psVar2;
  mutex *__mutex;
  bool bVar3;
  work *__ptr;
  impl_type *piVar4;
  int iVar5;
  future_status fVar6;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  
  if ((this->running)._M_i == stopped) {
    LOCK();
    (this->runCounter).super___atomic_base<int>._M_i = 0;
    UNLOCK();
  }
  else {
    LOCK();
    paVar1 = &this->runCounter;
    iVar5 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    if (iVar5 + -1 < 1) {
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->runningLoopLock);
      if (iVar5 != 0) {
        std::__throw_system_error(iVar5);
      }
      if (((this->runCounter).super___atomic_base<int>._M_i < 1) &&
         ((this->nullwork)._M_t.
          super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
          ._M_t.
          super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>
          .super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl != (work *)0x0)) {
        LOCK();
        (this->terminateLoop)._M_base._M_i = true;
        UNLOCK();
        __ptr = (this->nullwork)._M_t.
                super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
                ._M_t.
                super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>
                .super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl;
        (this->nullwork)._M_t.
        super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>.
        _M_t.
        super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>
        .super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl = (work *)0x0;
        if (__ptr != (work *)0x0) {
          std::default_delete<asio::io_context::work>::operator()
                    ((default_delete<asio::io_context::work> *)&this->nullwork,__ptr);
        }
        piVar4 = ((this->ictx)._M_t.
                  super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>
                  .super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl)->impl_;
        bVar3 = (piVar4->mutex_).enabled_;
        if (bVar3 == true) {
          pthread_mutex_lock((pthread_mutex_t *)&(piVar4->mutex_).mutex_);
        }
        piVar4->stopped_ = true;
        if ((piVar4->mutex_).enabled_ == true) {
          psVar2 = &(piVar4->wakeup_event_).event_.state_;
          *(byte *)psVar2 = (byte)*psVar2 | 1;
          pthread_cond_broadcast((pthread_cond_t *)&(piVar4->wakeup_event_).event_);
        }
        if ((piVar4->task_interrupted_ == false) && (piVar4->task_ != (scheduler_task *)0x0)) {
          piVar4->task_interrupted_ = true;
          (*piVar4->task_->_vptr_scheduler_task[1])();
        }
        if (bVar3 != false) {
          pthread_mutex_unlock((pthread_mutex_t *)&(piVar4->mutex_).mutex_);
        }
        while( true ) {
          local_30.__r = 0;
          fVar6 = std::__basic_future<void>::wait_for<long,std::ratio<1l,1000l>>
                            (&(this->loopRet).super___basic_future<void>,&local_30);
          if (fVar6 != timeout) break;
          sched_yield();
        }
        std::__basic_future<void>::_M_get_result(&(this->loopRet).super___basic_future<void>);
        piVar4 = ((this->ictx)._M_t.
                  super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>
                  .super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl)->impl_;
        if ((piVar4->mutex_).enabled_ == true) {
          __mutex = &(piVar4->mutex_).mutex_;
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          piVar4->stopped_ = false;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        else {
          piVar4->stopped_ = false;
        }
        LOCK();
        (this->terminateLoop)._M_base._M_i = false;
        UNLOCK();
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->runningLoopLock);
    }
  }
  return;
}

Assistant:

void AsioContextManager::haltContextLoop()
{
    if (isRunning()) {
        // std::cout << "context loop halted "<<ptr->runCounter<<"\n";
        if (--runCounter <= 0) {
            std::lock_guard<std::mutex> nullLock(runningLoopLock);
            //    std::cout << "calling halt on context loop \n";

            if (runCounter <= 0) {
                if (nullwork) {
                    terminateLoop = true;
                    nullwork.reset();
                    ictx->stop();
                    int lcnt = 0;
                    while (loopRet.wait_for(std::chrono::milliseconds(0)) ==
                           std::future_status::timeout) {
                        if (lcnt == 0) {
                            std::this_thread::yield();
                        } else {
                            std::this_thread::sleep_for(
                                std::chrono::milliseconds(50));
                            ++lcnt;
                            ictx->stop();
                        }
                    }
                    loopRet.get();
                    ictx->reset();  // prepare for future runs
                    terminateLoop = false;
                }
            }
        }
    } else {
        runCounter.store(0);
    }
}